

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O3

uint64_t read_hex(char **ptr)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = (int)**ptr;
  uVar5 = (ulong)(iVar4 - 0x37);
  if (5 < iVar4 - 0x41U) {
    uVar5 = 0xffffffff;
  }
  if (iVar4 - 0x30U < 10) {
    uVar5 = (ulong)(iVar4 - 0x30U);
  }
  if (-1 < (int)uVar5) {
    pcVar3 = *ptr + -1;
    uVar2 = 0;
    do {
      if (uVar2 >> 0x3c != 0) {
        __assert_fail("(res >> 60) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x854,"uint64_t read_hex(const char **)");
      }
      iVar4 = (int)pcVar3[2];
      uVar2 = uVar5 + uVar2 * 0x10;
      uVar1 = iVar4 - 0x37;
      if (5 < iVar4 - 0x41U) {
        uVar1 = 0xffffffff;
      }
      if (iVar4 - 0x30U < 10) {
        uVar1 = iVar4 - 0x30U;
      }
      uVar5 = (ulong)uVar1;
      pcVar3 = pcVar3 + 1;
    } while (-1 < (int)uVar1);
    *ptr = pcVar3;
    return uVar2;
  }
  __assert_fail("p != *ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x857,"uint64_t read_hex(const char **)");
}

Assistant:

static uint64_t read_hex (const char **ptr) {
  int v;
  const char *p;
  uint64_t res = 0;

  for (p = *ptr; (v = hex_value (*p)) >= 0; p++) {
    gen_assert ((res >> 60) == 0);
    res = res * 16 + v;
  }
  gen_assert (p != *ptr);
  *ptr = p - 1;
  return res;
}